

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

Sprite * __thiscall olc::Sprite::Duplicate(Sprite *this,vi2d *vPos,vi2d *vSize)

{
  int iVar1;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 aVar2;
  Sprite *this_00;
  int iVar3;
  int iVar4;
  
  this_00 = (Sprite *)operator_new(0x28);
  Sprite(this_00,vSize->x,vSize->y);
  if (0 < vSize->y) {
    iVar3 = 0;
    do {
      if (0 < vSize->x) {
        iVar4 = 0;
        do {
          iVar1 = this_00->width;
          if ((iVar4 < iVar1) && (iVar3 < this_00->height)) {
            aVar2 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
                    GetPixel(this,vPos->x + iVar4,vPos->y + iVar3);
            (this_00->pColData).super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)(iVar1 * iVar3 + iVar4)].field_0.field_1 = aVar2;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < vSize->x);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < vSize->y);
  }
  return this_00;
}

Assistant:

olc::Sprite* Sprite::Duplicate(const olc::vi2d& vPos, const olc::vi2d& vSize)
	{
		olc::Sprite* spr = new olc::Sprite(vSize.x, vSize.y);
		for (int y = 0; y < vSize.y; y++)
			for (int x = 0; x < vSize.x; x++)
				spr->SetPixel(x, y, GetPixel(vPos.x + x, vPos.y + y));
		return spr;
	}